

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Plink_delete(plink *plp)

{
  plink *ppVar1;
  
  if (plp != (plink *)0x0) {
    do {
      ppVar1 = plp;
      plp = ppVar1->next;
      ppVar1->next = plink_freelist;
      plink_freelist = ppVar1;
    } while (plp != (plink *)0x0);
  }
  return;
}

Assistant:

void Plink_delete(struct plink *plp)
{
  struct plink *nextpl;

  while( plp ){
    nextpl = plp->next;
    plp->next = plink_freelist;
    plink_freelist = plp;
    plp = nextpl;
  }
}